

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall CConnman::OutboundTargetReached(CConnman *this,bool historicalBlockServingLimit)

{
  long lVar1;
  seconds __lhs;
  type_conflict5 tVar2;
  byte in_SIL;
  char *in_RDI;
  long in_FS_OFFSET;
  uint64_t buffer;
  seconds timeLeftInCycle;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock99;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  duration<long,_std::ratio<60L,_1L>_> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa8;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffb0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffb8;
  bool local_2d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(Mutex *)0x22086c);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RDI,
             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff98 >> 0x18,0));
  if (*(long *)(in_RDI + 0x48) == 0) {
    local_2d = false;
  }
  else {
    if ((in_SIL & 1) == 0) {
      if (*(ulong *)(in_RDI + 0x48) <= *(ulong *)(in_RDI + 0x38)) {
        local_2d = true;
        goto LAB_002209a1;
      }
    }
    else {
      __lhs = GetMaxOutboundTimeLeftInCycle_
                        ((CConnman *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                ((duration<long,_std::ratio<60L,_1L>_> *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),(int *)0x2208f5);
      tVar2 = std::chrono::operator/
                        ((duration<long,_std::ratio<1L,_1L>_> *)__lhs.__r,in_stack_ffffffffffffff90)
      ;
      if ((*(ulong *)(in_RDI + 0x48) <= (ulong)(tVar2 * 4000000)) ||
         ((ulong)(*(long *)(in_RDI + 0x48) + tVar2 * -4000000) <= *(ulong *)(in_RDI + 0x38))) {
        local_2d = true;
        goto LAB_002209a1;
      }
    }
    local_2d = false;
  }
LAB_002209a1:
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_2d;
}

Assistant:

bool CConnman::OutboundTargetReached(bool historicalBlockServingLimit) const
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);
    LOCK(m_total_bytes_sent_mutex);
    if (nMaxOutboundLimit == 0)
        return false;

    if (historicalBlockServingLimit)
    {
        // keep a large enough buffer to at least relay each block once
        const std::chrono::seconds timeLeftInCycle = GetMaxOutboundTimeLeftInCycle_();
        const uint64_t buffer = timeLeftInCycle / std::chrono::minutes{10} * MAX_BLOCK_SERIALIZED_SIZE;
        if (buffer >= nMaxOutboundLimit || nMaxOutboundTotalBytesSentInCycle >= nMaxOutboundLimit - buffer)
            return true;
    }
    else if (nMaxOutboundTotalBytesSentInCycle >= nMaxOutboundLimit)
        return true;

    return false;
}